

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
          (QMovableArrayOps<QModelIndex> *this,qsizetype i,QModelIndex *args)

{
  QModelIndex **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  QModelIndex *pQVar7;
  quintptr qVar8;
  QAbstractItemModel *pQVar9;
  qsizetype qVar10;
  long in_FS_OFFSET;
  bool bVar11;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_004cb352;
  if ((this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size == i) {
    qVar10 = QArrayDataPointer<QModelIndex>::freeSpaceAtEnd((QArrayDataPointer<QModelIndex> *)this);
    if (qVar10 == 0) goto LAB_004cb349;
    lVar6 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size;
    pQVar7 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
    pQVar7[lVar6].m.ptr = (args->m).ptr;
    iVar3 = args->c;
    qVar8 = args->i;
    pQVar7 = pQVar7 + lVar6;
    pQVar7->r = args->r;
    pQVar7->c = iVar3;
    pQVar7->i = qVar8;
  }
  else {
LAB_004cb349:
    if (i == 0) {
      qVar10 = QArrayDataPointer<QModelIndex>::freeSpaceAtBegin
                         ((QArrayDataPointer<QModelIndex> *)this);
      if (qVar10 == 0) goto LAB_004cb352;
      pQVar7 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
      pQVar7[-1].m.ptr = (args->m).ptr;
      iVar3 = args->c;
      qVar8 = args->i;
      pQVar7[-1].r = args->r;
      pQVar7[-1].c = iVar3;
      pQVar7[-1].i = qVar8;
    }
    else {
LAB_004cb352:
      iVar3 = args->r;
      iVar4 = args->c;
      qVar8 = args->i;
      pQVar9 = (args->m).ptr;
      bVar11 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size
               != 0;
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this,(uint)(i == 0 && bVar11),1,
                 (QModelIndex **)0x0,(QArrayDataPointer<QModelIndex> *)0x0);
      if (i != 0 || !bVar11) {
        Inserter::Inserter(&local_60,(QArrayDataPointer<QModelIndex> *)this,i,1);
        (local_60.displaceFrom)->r = iVar3;
        (local_60.displaceFrom)->c = iVar4;
        (local_60.displaceFrom)->i = qVar8;
        ((local_60.displaceFrom)->m).ptr = pQVar9;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_004cb3ee;
      }
      pQVar7 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
      pQVar7[-1].r = iVar3;
      pQVar7[-1].c = iVar4;
      pQVar7[-1].i = qVar8;
      pQVar7[-1].m.ptr = pQVar9;
    }
    ppQVar1 = &(this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_004cb3ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }